

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O1

_Bool container_internal_validate(container_t *container,uint8_t typecode,char **reason)

{
  bool bVar1;
  array_container_t *paVar2;
  uint8_t uVar3;
  _Bool _Var4;
  char *pcVar5;
  
  if (container == (container_t *)0x0) {
    pcVar5 = "container is NULL";
    goto LAB_00110089;
  }
  if (typecode == '\x04') {
    if (*(int *)((long)container + 0xc) == 0) {
      pcVar5 = "shared container has zero refcount";
LAB_00110043:
      *reason = pcVar5;
      bVar1 = false;
      paVar2 = (array_container_t *)container;
      uVar3 = typecode;
    }
    else {
      if (*(uint8_t *)((long)container + 8) == '\x04') {
        pcVar5 = "shared container is nested";
        goto LAB_00110043;
      }
      bVar1 = true;
      paVar2 = *container;
      uVar3 = *(uint8_t *)((long)container + 8);
      if (*container == (array_container_t *)0x0) {
        pcVar5 = "shared container has NULL container";
        goto LAB_00110043;
      }
    }
    typecode = uVar3;
    container = paVar2;
    if (!bVar1) {
      return false;
    }
  }
  if (typecode == '\x03') {
    _Var4 = run_container_validate((run_container_t *)container,reason);
    return _Var4;
  }
  if (typecode == '\x02') {
    _Var4 = array_container_validate((array_container_t *)container,reason);
    return _Var4;
  }
  if (typecode == '\x01') {
    _Var4 = bitset_container_validate((bitset_container_t *)container,reason);
    return _Var4;
  }
  pcVar5 = "invalid typecode";
LAB_00110089:
  *reason = pcVar5;
  return false;
}

Assistant:

bool container_internal_validate(const container_t *container, uint8_t typecode,
                                 const char **reason) {
    if (container == NULL) {
        *reason = "container is NULL";
        return false;
    }
    // Not using container_unwrap_shared because it asserts if shared containers
    // are nested
    if (typecode == SHARED_CONTAINER_TYPE) {
        const shared_container_t *shared_container =
            const_CAST_shared(container);
        if (croaring_refcount_get(&shared_container->counter) == 0) {
            *reason = "shared container has zero refcount";
            return false;
        }
        if (shared_container->typecode == SHARED_CONTAINER_TYPE) {
            *reason = "shared container is nested";
            return false;
        }
        if (shared_container->container == NULL) {
            *reason = "shared container has NULL container";
            return false;
        }
        container = shared_container->container;
        typecode = shared_container->typecode;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_validate(const_CAST_bitset(container),
                                             reason);
        case ARRAY_CONTAINER_TYPE:
            return array_container_validate(const_CAST_array(container),
                                            reason);
        case RUN_CONTAINER_TYPE:
            return run_container_validate(const_CAST_run(container), reason);
        default:
            *reason = "invalid typecode";
            return false;
    }
}